

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::ApplyVertexToEffectSemanticMapping
          (ColladaLoader *this,Sampler *sampler,SemanticMappingTable *table)

{
  bool bVar1;
  pointer ppVar2;
  Logger *this_00;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  SemanticMappingTable *table_local;
  Sampler *sampler_local;
  ColladaLoader *this_local;
  
  it._M_node = (_Base_ptr)table;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
       ::find(&table->mMap,&sampler->mUVChannel);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
       ::end(it._M_node + 1);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>
             ::operator->(&local_28);
    if ((ppVar2->second).mType != IT_Texcoord) {
      this_00 = DefaultLogger::get();
      Logger::error(this_00,"Collada: Unexpected effect input mapping");
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>
             ::operator->(&local_28);
    sampler->mUVId = (ppVar2->second).mSet;
  }
  return;
}

Assistant:

void ColladaLoader::ApplyVertexToEffectSemanticMapping(Collada::Sampler& sampler,

        const Collada::SemanticMappingTable& table) {
    std::map<std::string, Collada::InputSemanticMapEntry>::const_iterator it = table.mMap.find(sampler.mUVChannel);
    if (it != table.mMap.end()) {
        if (it->second.mType != Collada::IT_Texcoord) {
            ASSIMP_LOG_ERROR("Collada: Unexpected effect input mapping");
        }

        sampler.mUVId = it->second.mSet;
    }
}